

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyDropEmptyElements(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  Node *node_00;
  
  while (node_00 = node, node_00 != (Node *)0x0) {
    node = node_00->next;
    if (node_00->content != (Node *)0x0) {
      prvTidyDropEmptyElements(doc,node_00->content);
    }
    BVar1 = prvTidynodeIsElement(node_00);
    if ((BVar1 != no) ||
       ((BVar1 = prvTidynodeIsText(node_00), BVar1 != no && (node_00->end <= node_00->start)))) {
      node = prvTidyTrimEmptyElement(doc,node_00);
    }
  }
  return (Node *)0x0;
}

Assistant:

Node* TY_(DropEmptyElements)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (node->content)
            TY_(DropEmptyElements)(doc, node->content);

        if (!TY_(nodeIsElement)(node) &&
            !(TY_(nodeIsText)(node) && !(node->start < node->end)))
        {
            node = next;
            continue;
        }

        next = TY_(TrimEmptyElement)(doc, node);
        node = next;
    }

    return node;
}